

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Server::write_response_core
          (Server *this,Stream *strm,bool close_connection,Request *req,Response *res,
          bool need_apply_ranges)

{
  size_t l;
  bool bVar1;
  bool bVar2;
  HandlerResponse HVar3;
  ssize_t sVar4;
  long lVar5;
  string s;
  string boundary;
  string content_type;
  allocator<char> local_c2;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  char *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined8 local_78;
  string local_70;
  string local_50;
  
  if ((399 < res->status) &&
     ((this->error_handler_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    HVar3 = detail::std::
            function<httplib::Server::HandlerResponse_(const_httplib::Request_&,_httplib::Response_&)>
            ::operator()(&this->error_handler_,req,res);
    need_apply_ranges = HVar3 == Handled || need_apply_ranges;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70.field_2._M_local_buf[0] = '\0';
  if (need_apply_ranges != false) {
    apply_ranges(this,req,res,&local_50,&local_70);
  }
  if (close_connection) {
LAB_00164ab3:
    std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"Connection",&local_c2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"close",&local_c1);
    Response::set_header(res,(string *)local_a0,&local_c0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Connection",&local_c2);
    Request::get_header_value((string *)local_a0,req,&local_c0,"",0);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a0,"close");
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    if (bVar1) goto LAB_00164ab3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,"timeout=",(allocator<char> *)&local_c0);
    detail::std::__cxx11::to_string(&local_c0,this->keep_alive_timeout_sec_);
    std::__cxx11::string::append((string *)local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::append(local_a0);
    detail::std::__cxx11::to_string(&local_c0,this->keep_alive_max_count_);
    std::__cxx11::string::append((string *)local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Keep-Alive",&local_c2);
    Response::set_header(res,&local_c0,(string *)local_a0);
  }
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)local_a0);
  if ((((res->body)._M_string_length != 0) || (res->content_length_ != 0)) ||
     ((res->content_provider_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,"Content-Type",(allocator<char> *)&local_c0);
    bVar1 = Response::has_header(res,(string *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a0,"Content-Type",&local_c2);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"text/plain",&local_c1)
      ;
      Response::set_header(res,(string *)local_a0,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)local_a0);
    }
  }
  if ((((res->body)._M_string_length == 0) && (res->content_length_ == 0)) &&
     ((res->content_provider_).super__Function_base._M_manager == (_Manager_type)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,"Content-Length",(allocator<char> *)&local_c0);
    bVar1 = Response::has_header(res,(string *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a0,"Content-Length",&local_c2);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"0",&local_c1);
      Response::set_header(res,(string *)local_a0,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)local_a0);
    }
  }
  bVar1 = std::operator==(&req->method,"HEAD");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,"Accept-Ranges",(allocator<char> *)&local_c0);
    bVar1 = Response::has_header(res,(string *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a0,"Accept-Ranges",&local_c2);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"bytes",&local_c1);
      Response::set_header(res,(string *)local_a0,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)local_a0);
    }
  }
  if ((this->post_routing_handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    detail::std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
              (&this->post_routing_handler_,req,res);
  }
  local_a0 = (undefined1  [8])&PTR__BufferStream_00292e90;
  local_98 = local_90._M_local_buf + 8;
  local_90._M_allocated_capacity = 0;
  local_90._M_local_buf[8] = '\0';
  local_78 = 0;
  sVar4 = detail::write_response_line((Stream *)local_a0,res->status);
  if (sVar4 != 0) {
    lVar5 = detail::std::
            function<long_(httplib::Stream_&,_std::unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::case_ignore::hash,_httplib::detail::case_ignore::equal_to,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
            ::operator()(&this->header_writer_,(Stream *)local_a0,&res->headers);
    if (lVar5 != 0) {
      detail::write_data(strm,local_98,local_90._M_allocated_capacity);
      std::__cxx11::string::~string((string *)&local_98);
      bVar2 = std::operator!=(&req->method,"HEAD");
      bVar1 = true;
      if (bVar2) {
        l = (res->body)._M_string_length;
        if (l == 0) {
          if ((res->content_provider_).super__Function_base._M_manager != (_Manager_type)0x0) {
            bVar2 = write_content_with_provider(this,strm,req,res,&local_70,&local_50);
            if (bVar2) {
              res->content_provider_success_ = true;
            }
            else {
              bVar1 = false;
            }
          }
        }
        else {
          bVar1 = detail::write_data(strm,(res->body)._M_dataplus._M_p,l);
        }
      }
      if ((this->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
        detail::std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::
        operator()(&this->logger_,req,res);
      }
      goto LAB_00164e86;
    }
  }
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = false;
LAB_00164e86:
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return bVar1;
}

Assistant:

inline bool Server::write_response_core(Stream &strm, bool close_connection,
                                        const Request &req, Response &res,
                                        bool need_apply_ranges) {
  assert(res.status != -1);

  if (400 <= res.status && error_handler_ &&
      error_handler_(req, res) == HandlerResponse::Handled) {
    need_apply_ranges = true;
  }

  std::string content_type;
  std::string boundary;
  if (need_apply_ranges) { apply_ranges(req, res, content_type, boundary); }

  // Prepare additional headers
  if (close_connection || req.get_header_value("Connection") == "close") {
    res.set_header("Connection", "close");
  } else {
    std::string s = "timeout=";
    s += std::to_string(keep_alive_timeout_sec_);
    s += ", max=";
    s += std::to_string(keep_alive_max_count_);
    res.set_header("Keep-Alive", s);
  }

  if ((!res.body.empty() || res.content_length_ > 0 || res.content_provider_) &&
      !res.has_header("Content-Type")) {
    res.set_header("Content-Type", "text/plain");
  }

  if (res.body.empty() && !res.content_length_ && !res.content_provider_ &&
      !res.has_header("Content-Length")) {
    res.set_header("Content-Length", "0");
  }

  if (req.method == "HEAD" && !res.has_header("Accept-Ranges")) {
    res.set_header("Accept-Ranges", "bytes");
  }

  if (post_routing_handler_) { post_routing_handler_(req, res); }

  // Response line and headers
  {
    detail::BufferStream bstrm;
    if (!detail::write_response_line(bstrm, res.status)) { return false; }
    if (!header_writer_(bstrm, res.headers)) { return false; }

    // Flush buffer
    auto &data = bstrm.get_buffer();
    detail::write_data(strm, data.data(), data.size());
  }

  // Body
  auto ret = true;
  if (req.method != "HEAD") {
    if (!res.body.empty()) {
      if (!detail::write_data(strm, res.body.data(), res.body.size())) {
        ret = false;
      }
    } else if (res.content_provider_) {
      if (write_content_with_provider(strm, req, res, boundary, content_type)) {
        res.content_provider_success_ = true;
      } else {
        ret = false;
      }
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return ret;
}